

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

char * baseFilename(char *filename)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (filename == (char *)0x0) {
    return (char *)0x0;
  }
  sVar2 = strlen(filename);
  pcVar1 = filename + sVar2;
  do {
    pcVar3 = pcVar1;
    if (pcVar3 <= filename) break;
    pcVar1 = pcVar3 + -1;
  } while (*pcVar3 != '/');
  return pcVar3 + (*pcVar3 == '/');
}

Assistant:

static const char *baseFilename(const char *filename) {
    const char *cur;
    if (filename == NULL)
        return(NULL);
    cur = &filename[strlen(filename)];
    while ((cur > filename) && (*cur != '/'))
        cur--;
    if (*cur == '/')
        return(cur + 1);
    return(cur);
}